

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

Endpoints * __thiscall
icu_63::number::impl::ParsedPatternInfo::getEndpoints(ParsedPatternInfo *this,int32_t flags)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0x1a0;
  if ((((~flags & 0x600U) != 0) && (lVar1 = 0xf0, ((uint)flags >> 10 & 1) == 0)) &&
     (lVar1 = 400, (~flags & 0x300U) != 0)) {
    lVar2 = 0x198;
    if (((uint)flags >> 9 & 1) == 0) {
      lVar2 = 0xe8;
    }
    lVar1 = 0xe0;
    if (((uint)flags >> 8 & 1) == 0) {
      lVar1 = lVar2;
    }
  }
  return (Endpoints *)((long)&(this->super_AffixPatternProvider)._vptr_AffixPatternProvider + lVar1)
  ;
}

Assistant:

const Endpoints& ParsedPatternInfo::getEndpoints(int32_t flags) const {
    bool prefix = (flags & AFFIX_PREFIX) != 0;
    bool isNegative = (flags & AFFIX_NEGATIVE_SUBPATTERN) != 0;
    bool padding = (flags & AFFIX_PADDING) != 0;
    if (isNegative && padding) {
        return negative.paddingEndpoints;
    } else if (padding) {
        return positive.paddingEndpoints;
    } else if (prefix && isNegative) {
        return negative.prefixEndpoints;
    } else if (prefix) {
        return positive.prefixEndpoints;
    } else if (isNegative) {
        return negative.suffixEndpoints;
    } else {
        return positive.suffixEndpoints;
    }
}